

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_buffer.cpp
# Opt level: O0

tuple<const_char_*,_long> __thiscall ReadBuffer::get_line(ReadBuffer *this)

{
  char *extraout_RDX;
  char *extraout_RDX_00;
  _Head_base<0UL,_const_char_*,_false> _Var1;
  long *in_RSI;
  tuple<const_char_*,_long> tVar2;
  int local_58 [2];
  tuple<std::nullptr_t,_int> local_50;
  long local_40;
  long local_38;
  undefined1 local_30 [8];
  tuple<char_*,_long> result;
  ssize_t i;
  ReadBuffer *this_local;
  
  result.super__Tuple_impl<0UL,_char_*,_long>.super__Head_base<0UL,_char_*,_false>._M_head_impl =
       (char *)in_RSI[2];
  do {
    if (in_RSI[3] <=
        (long)(result.super__Tuple_impl<0UL,_char_*,_long>.super__Head_base<0UL,_char_*,_false>.
               _M_head_impl + 1)) {
      local_58[0] = 0;
      local_58[1] = 0;
      std::make_tuple<decltype(nullptr),int>((void **)&local_50,local_58);
      std::tuple<const_char_*,_long>::tuple<std::nullptr_t,_int,_true>
                ((tuple<const_char_*,_long> *)this,&local_50);
      _Var1._M_head_impl = extraout_RDX_00;
LAB_00113df5:
      tVar2.super__Tuple_impl<0UL,_const_char_*,_long>.super__Head_base<0UL,_const_char_*,_false>.
      _M_head_impl = _Var1._M_head_impl;
      tVar2.super__Tuple_impl<0UL,_const_char_*,_long>.super__Tuple_impl<1UL,_long>.
      super__Head_base<1UL,_long,_false>._M_head_impl =
           (_Head_base<1UL,_long,_false>)(_Head_base<1UL,_long,_false>)this;
      return (tuple<const_char_*,_long>)tVar2.super__Tuple_impl<0UL,_const_char_*,_long>;
    }
    if ((result.super__Tuple_impl<0UL,_char_*,_long>.super__Head_base<0UL,_char_*,_false>.
         _M_head_impl[*in_RSI] == '\r') &&
       (result.super__Tuple_impl<0UL,_char_*,_long>.super__Head_base<0UL,_char_*,_false>.
        _M_head_impl[*in_RSI + 1] == '\n')) {
      local_38 = *in_RSI + in_RSI[2];
      local_40 = (long)result.super__Tuple_impl<0UL,_char_*,_long>.
                       super__Head_base<0UL,_char_*,_false>._M_head_impl - in_RSI[2];
      std::make_tuple<char*,long>((char **)local_30,&local_38);
      in_RSI[2] = (long)(result.super__Tuple_impl<0UL,_char_*,_long>.
                         super__Head_base<0UL,_char_*,_false>._M_head_impl + 2);
      std::tuple<const_char_*,_long>::tuple<char_*,_long,_true>
                ((tuple<const_char_*,_long> *)this,(tuple<char_*,_long> *)local_30);
      _Var1._M_head_impl = extraout_RDX;
      goto LAB_00113df5;
    }
    result.super__Tuple_impl<0UL,_char_*,_long>.super__Head_base<0UL,_char_*,_false>._M_head_impl =
         result.super__Tuple_impl<0UL,_char_*,_long>.super__Head_base<0UL,_char_*,_false>.
         _M_head_impl + 1;
  } while( true );
}

Assistant:

std::tuple<const char *, ssize_t> ReadBuffer::get_line() {
    ssize_t i;
    for (i = this->left; i + 1 < this->right; i++) {
        if (this->buffer[i] == '\r' && this->buffer[i + 1] == '\n') {
            auto result = std::make_tuple(this->buffer + this->left, i - this->left);
            this->left = i + 2;
            return result;
        }
    }
    return std::make_tuple(nullptr, 0);
}